

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

BOOL __thiscall Js::DiagStackFrame::IsThisAvailable(DiagStackFrame *this)

{
  int iVar1;
  BOOL BVar2;
  undefined4 extraout_var;
  ParseableFunctionInfo *this_00;
  bool local_19;
  JavascriptFunction *scopeFunction;
  DiagStackFrame *this_local;
  
  iVar1 = (*this->_vptr_DiagStackFrame[2])();
  BVar2 = JavascriptFunction::IsLambda((JavascriptFunction *)CONCAT44(extraout_var,iVar1));
  local_19 = true;
  if (BVar2 != 0) {
    this_00 = JavascriptFunction::GetParseableFunctionInfo
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar1));
    local_19 = FunctionProxy::GetCapturesThis(&this_00->super_FunctionProxy);
  }
  return (BOOL)local_19;
}

Assistant:

BOOL DiagStackFrame::IsThisAvailable()
    {
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        return !scopeFunction->IsLambda() || scopeFunction->GetParseableFunctionInfo()->GetCapturesThis();
    }